

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

size_t __thiscall
SGParser::Generator::GrammarOutputC::CreateTerminalEnum
          (GrammarOutputC *this,String *str,Lex *lex,String *name,String *prefix)

{
  size_t size;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  terminalVec;
  String dest;
  String *prefix_local;
  String *name_local;
  Lex *lex_local;
  String *str_local;
  GrammarOutputC *this_local;
  
  if ((this->super_GrammarOutput).pGrammar == (Grammar *)0x0) {
    this_local = (GrammarOutputC *)0x0;
  }
  else {
    std::__cxx11::string::string
              ((string *)
               &terminalVec.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&size);
    this_local = (GrammarOutputC *)
                 Grammar::CreateTerminalVector
                           ((this->super_GrammarOutput).pGrammar,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&size,lex);
    createEnum<SGParser::Generator::GrammarOutputC::CreateTerminalEnum(std::__cxx11::string&,SGParser::Generator::Lex_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
              (this,(String *)
                    &terminalVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,name,prefix,
               (size_t)this_local,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&size);
    std::__cxx11::string::swap((string *)str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&size);
    std::__cxx11::string::~string
              ((string *)
               &terminalVec.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return (size_t)this_local;
}

Assistant:

size_t GrammarOutputC::CreateTerminalEnum(String& str, const Lex& lex, const String& name,
                                          const String& prefix) const {
    if (!pGrammar)
        return 0u;

    String dest;

    std::vector<String> terminalVec;
    const auto size = pGrammar->CreateTerminalVector(terminalVec, lex);

    // Generate strings
    createEnum(dest, name, prefix, size,
               [&](size_t index) {
                   return terminalVec[index];
               });

    str.swap(dest);

    return size;
}